

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O0

Gia_Man_t * Gia_ManPerformMfs(Gia_Man_t *p,Sfm_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  Sfm_Ntk_t *p_00;
  Vec_Int_t *pVVar3;
  int nNodes;
  int nFaninMax;
  Gia_Man_t *pNew;
  Sfm_Ntk_t *pNtk;
  Sfm_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x1f5,"Gia_Man_t *Gia_ManPerformMfs(Gia_Man_t *, Sfm_Par_t *)");
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    if ((p->pManTime == (void *)0x0) || (p->pAigExtra != (Gia_Man_t *)0x0)) {
      if ((p->pManTime == (void *)0x0) ||
         ((p->pAigExtra == (Gia_Man_t *)0x0 || (iVar1 = Gia_ManCiNum(p->pAigExtra), iVar1 < 0x10))))
      {
        iVar1 = Gia_ManLutSizeMax(p);
        if (iVar1 < 0x10) {
          p_00 = Gia_ManExtractMfs(p);
          uVar2 = Sfm_NtkPerform(p_00,pPars);
          if (uVar2 == 0) {
            if (p->pManTime != (void *)0x0) {
              Abc_Print(1,"The network is not changed by \"&mfs\".\n");
            }
            _nNodes = Gia_ManDup(p);
            pVVar3 = Vec_IntDup(p->vMapping);
            _nNodes->vMapping = pVVar3;
            Gia_ManTransferTiming(_nNodes,p);
          }
          else {
            _nNodes = Gia_ManInsertMfs(p,p_00,pPars->fAllBoxes);
            if (pPars->fVerbose != 0) {
              Abc_Print(1,"The network has %d nodes changed by \"&mfs\".\n",(ulong)uVar2);
            }
          }
          Sfm_NtkFree(p_00);
          p_local = _nNodes;
        }
        else {
          Abc_Print(1,
                    "Currently \"&mfs\" cannot process the network containing nodes with more than 15 fanins.\n"
                   );
          p_local = (Gia_Man_t *)0x0;
        }
      }
      else {
        Abc_Print(1,
                  "Currently \"&mfs\" cannot process the network containing white-boxes with more than 15 inputs.\n"
                 );
        p_local = (Gia_Man_t *)0x0;
      }
    }
    else {
      Abc_Print(1,"Timing manager is given but there is no GIA of boxes.\n");
      p_local = (Gia_Man_t *)0x0;
    }
    return p_local;
  }
  __assert_fail("p->vMapping != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                ,0x1f6,"Gia_Man_t *Gia_ManPerformMfs(Gia_Man_t *, Sfm_Par_t *)");
}

Assistant:

Gia_Man_t * Gia_ManPerformMfs( Gia_Man_t * p, Sfm_Par_t * pPars )
{
    Sfm_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    int nFaninMax, nNodes;
    assert( Gia_ManRegNum(p) == 0 );
    assert( p->vMapping != NULL );
    if ( p->pManTime != NULL && p->pAigExtra == NULL )
    {
        Abc_Print( 1, "Timing manager is given but there is no GIA of boxes.\n" );
        return NULL;
    }
    if ( p->pManTime != NULL && p->pAigExtra != NULL && Gia_ManCiNum(p->pAigExtra) > 15 )
    {
        Abc_Print( 1, "Currently \"&mfs\" cannot process the network containing white-boxes with more than 15 inputs.\n" );
        return NULL;
    }
    // count fanouts
    nFaninMax = Gia_ManLutSizeMax( p );
    if ( nFaninMax > 15 )
    {
        Abc_Print( 1, "Currently \"&mfs\" cannot process the network containing nodes with more than 15 fanins.\n" );
        return NULL;
    }
    // collect information
    pNtk = Gia_ManExtractMfs( p );
    // perform optimization
    nNodes = Sfm_NtkPerform( pNtk, pPars );
    if ( nNodes == 0 )
    {
        if ( p->pManTime )
        Abc_Print( 1, "The network is not changed by \"&mfs\".\n" );
        pNew = Gia_ManDup( p );
        pNew->vMapping = Vec_IntDup( p->vMapping );
        Gia_ManTransferTiming( pNew, p );
    }
    else
    {
        pNew = Gia_ManInsertMfs( p, pNtk, pPars->fAllBoxes );
        if( pPars->fVerbose )
            Abc_Print( 1, "The network has %d nodes changed by \"&mfs\".\n", nNodes );
        // check integrity
        //Gia_ManCheckIntegrityWithBoxes( pNew );
    }
    Sfm_NtkFree( pNtk );
    return pNew;
}